

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void __thiscall ALsource::~ALsource(ALsource *this)

{
  pointer pBVar1;
  iterator pvVar2;
  iterator pvVar3;
  long in_RDI;
  anon_class_1_0_00000001 clear_send;
  BufferStorage *buffer;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> head;
  BufferlistItem *BufferList;
  pointer in_stack_ffffffffffffffb8;
  unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *in_stack_ffffffffffffffc0;
  ALbuffer *in_stack_ffffffffffffffc8;
  __pointer_type local_10;
  
  local_10 = *(__pointer_type *)(in_RDI + 0x180);
  while (local_10 != (__pointer_type)0x0) {
    std::unique_ptr<BufferlistItem,std::default_delete<BufferlistItem>>::
    unique_ptr<std::default_delete<BufferlistItem>,void>
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::operator->
              ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)0x171650);
    local_10 = std::atomic<BufferlistItem_*>::load
                         ((atomic<BufferlistItem_*> *)in_stack_ffffffffffffffc8,
                          (memory_order)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
    pBVar1 = std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::operator->
                       ((unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_> *)0x171669
                       );
    if (pBVar1->mBuffer != (BufferStorage *)0x0) {
      in_stack_ffffffffffffffc8 = anon_unknown.dwarf_41b5d::BufferFromStorage(pBVar1->mBuffer);
      DecrementRef(&in_stack_ffffffffffffffc8->ref);
    }
    std::unique_ptr<BufferlistItem,_std::default_delete<BufferlistItem>_>::~unique_ptr
              (in_stack_ffffffffffffffc0);
  }
  *(undefined8 *)(in_RDI + 0x180) = 0;
  pvVar2 = std::array<ALsource::SendData,_6UL>::begin((array<ALsource::SendData,_6UL> *)0x1716c9);
  pvVar3 = std::array<ALsource::SendData,_6UL>::end((array<ALsource::SendData,_6UL> *)0x1716d7);
  std::for_each<ALsource::SendData*,ALsource::~SendData()::__0>(pvVar2,pvVar3);
  return;
}

Assistant:

ALsource::~ALsource()
{
    BufferlistItem *BufferList{queue};
    while(BufferList != nullptr)
    {
        std::unique_ptr<BufferlistItem> head{BufferList};
        BufferList = head->mNext.load(std::memory_order_relaxed);
        if(BufferStorage *buffer{head->mBuffer})
            DecrementRef(BufferFromStorage(buffer)->ref);
    }
    queue = nullptr;

    auto clear_send = [](ALsource::SendData &send) -> void
    { if(send.Slot) DecrementRef(send.Slot->ref); };
    std::for_each(Send.begin(), Send.end(), clear_send);
}